

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

void anon_unknown.dwarf_2c92::ndiGXHelper(ndicapi *pol,char *command,char *commandReply)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  int i;
  char (*pacVar4) [12];
  char (*pacVar5) [24];
  char (*pacVar6) [8];
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  char cVar10;
  char (*pacVar11) [52];
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  char (*pacVar16) [52];
  
  uVar3 = 1;
  if (command[2] == ' ') {
    cVar1 = command[3];
joined_r0x00108635:
    if (cVar1 != '\r') {
      lVar12 = 0;
      uVar3 = 0;
      do {
        cVar1 = command[lVar12 + 3];
        iVar15 = -0x57;
        if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar15 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
           (iVar15 = -0x30, 9 < (byte)(cVar1 - 0x30U))) break;
        uVar3 = uVar3 << 4 | (ulong)(uint)(iVar15 + cVar1);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
      if ((uVar3 & 1) == 0) {
        bVar2 = 0;
        goto LAB_00108743;
      }
    }
  }
  else if (command[2] == ':') {
    cVar1 = command[7];
    goto joined_r0x00108635;
  }
  pacVar11 = pol->GxTransforms;
  lVar12 = 0;
  do {
    lVar13 = 0;
    do {
      if (commandReply[lVar13] < ' ') break;
      (*pacVar11)[lVar13] = commandReply[lVar13];
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 0x33);
    pcVar8 = commandReply + lVar13;
    (*pacVar11)[lVar13] = '\0';
    cVar1 = *pcVar8;
    commandReply = pcVar8 + (cVar1 == '\n');
    lVar12 = lVar12 + 1;
    pacVar11 = pacVar11 + 1;
  } while (lVar12 != 3);
  lVar12 = 0;
  do {
    cVar10 = pcVar8[lVar12 + (ulong)(cVar1 == '\n')];
    if (cVar10 < ' ') {
      lVar13 = (ulong)(cVar1 == '\n') + lVar12;
      goto LAB_00108734;
    }
    pol->GxStatus[lVar12] = cVar10;
    lVar12 = lVar12 + 1;
  } while ((int)lVar12 != 8);
  lVar13 = lVar12 + (ulong)(cVar1 == '\n');
  cVar10 = pcVar8[lVar12 + (ulong)(cVar1 == '\n')];
LAB_00108734:
  commandReply = pcVar8 + lVar13 + (cVar10 == '\n');
  bVar2 = 1;
LAB_00108743:
  if ((uVar3 & 2) != 0) {
    pacVar4 = pol->GxInformation;
    lVar12 = 0;
    do {
      lVar13 = 0;
      do {
        if (commandReply[lVar13] < ' ') break;
        (*pacVar4)[lVar13] = commandReply[lVar13];
        lVar13 = lVar13 + 1;
      } while ((int)lVar13 != 0xc);
      commandReply = commandReply + lVar13;
      lVar12 = lVar12 + 1;
      pacVar4 = pacVar4 + 1;
    } while (lVar12 != 3);
    commandReply = commandReply + (*commandReply == '\n');
  }
  if ((uVar3 & 4) != 0) {
    pacVar5 = pol->GxSingleStray;
    lVar12 = 0;
    do {
      lVar13 = 0;
      do {
        if (commandReply[lVar13] < ' ') break;
        (*pacVar5)[lVar13] = commandReply[lVar13];
        lVar13 = lVar13 + 1;
      } while ((int)lVar13 != 0x15);
      (*pacVar5)[lVar13] = '\0';
      commandReply = commandReply + lVar13 + (commandReply[lVar13] == '\n');
      lVar12 = lVar12 + 1;
      pacVar5 = pacVar5 + 1;
    } while (lVar12 != 3);
  }
  if ((uVar3 & 8) != 0) {
    pacVar6 = pol->GxFrame;
    lVar12 = 0;
    do {
      lVar13 = 0;
      do {
        if (commandReply[lVar13] < ' ') break;
        (*pacVar6)[lVar13] = commandReply[lVar13];
        lVar13 = lVar13 + 1;
      } while ((int)lVar13 != 8);
      commandReply = commandReply + lVar13;
      lVar12 = lVar12 + 1;
      pacVar6 = pacVar6 + 1;
    } while (lVar12 != 3);
    commandReply = commandReply + (*commandReply == '\n');
  }
  if ((short)uVar3 < 0) {
    uVar7 = 9;
    if (((uint)uVar3 >> 0xd & 1) == 0) {
      uVar7 = 3;
    }
    if (!(bool)(uVar3 != 0x8000 & (bVar2 ^ 1))) {
      pacVar11 = pol->GxPassiveTransforms;
      pcVar8 = pol->GxPassiveStatus;
      uVar14 = 0;
      do {
        lVar12 = 0;
        pacVar16 = pacVar11;
        do {
          lVar13 = 0;
          do {
            if (commandReply[lVar13] < ' ') break;
            (*pacVar16)[lVar13] = commandReply[lVar13];
            lVar13 = lVar13 + 1;
          } while ((int)lVar13 != 0x33);
          pcVar9 = commandReply + lVar13;
          (*pacVar16)[lVar13] = '\0';
          cVar1 = *pcVar9;
          commandReply = pcVar9 + (cVar1 == '\n');
          lVar12 = lVar12 + 1;
          pacVar16 = pacVar16 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        do {
          cVar10 = pcVar9[lVar12 + (ulong)(cVar1 == '\n')];
          if (cVar10 < ' ') {
            lVar13 = (ulong)(cVar1 == '\n') + lVar12;
            goto LAB_001088f1;
          }
          pcVar8[lVar12] = cVar10;
          lVar12 = lVar12 + 1;
        } while ((int)lVar12 != 8);
        lVar13 = lVar12 + (ulong)(cVar1 == '\n');
        cVar10 = pcVar9[lVar12 + (ulong)(cVar1 == '\n')];
LAB_001088f1:
        uVar14 = uVar14 + 3;
        if (cVar10 != '\n') {
          uVar7 = uVar14 & 0xffffffff;
        }
        commandReply = pcVar9 + lVar13 + (cVar10 == '\n');
        pacVar11 = pacVar11 + 3;
        pcVar8 = pcVar8 + 8;
      } while ((long)uVar14 < (long)(int)uVar7);
      commandReply = commandReply + (*commandReply == '\n');
    }
    if ((uVar3 & 2) != 0) {
      if (0 < (int)uVar7) {
        pacVar4 = pol->GxPassiveInformation;
        uVar14 = 0;
        do {
          lVar12 = 0;
          do {
            if (commandReply[lVar12] < ' ') break;
            (*pacVar4)[lVar12] = commandReply[lVar12];
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0xc);
          commandReply = commandReply + lVar12;
          uVar14 = uVar14 + 1;
          pacVar4 = pacVar4 + 1;
        } while (uVar14 != uVar7);
      }
      commandReply = commandReply + (*commandReply == '\n');
    }
    if ((uVar3 & 8) != 0) {
      if (0 < (int)uVar7) {
        pacVar6 = pol->GxPassiveFrame;
        uVar14 = 0;
        do {
          lVar12 = 0;
          do {
            if (commandReply[lVar12] < ' ') break;
            (*pacVar6)[lVar12] = commandReply[lVar12];
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 8);
          commandReply = commandReply + lVar12;
          uVar14 = uVar14 + 1;
          pacVar6 = pacVar6 + 1;
        } while (uVar14 != uVar7);
      }
      commandReply = commandReply + (*commandReply == '\n');
    }
    if (((uint)uVar3 >> 0xc & 1) != 0) {
      lVar12 = 0;
      do {
        if (commandReply[lVar12] < ' ') {
          return;
        }
        pol->GxPassiveStray[lVar12] = commandReply[lVar12];
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 0x1a7);
    }
  }
  return;
}

Assistant:

void ndiGXHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode = NDI_XFORMS_AND_STATUS; // the default reply mode
    char* writePointer;
    int i, j, k;
    int passiveCount, activeCount;

    // if the GX command had a reply mode, read it
    if ((command[2] == ':' && command[7] != '\r') || (command[2] == ' ' && command[3] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[3], 4);
    }

    // always three active ports
    activeCount = 3;

    if (mode & NDI_XFORMS_AND_STATUS)
    {
      for (k = 0; k < activeCount; k += 3)
      {
        // grab the three transforms
        for (i = 0; i < 3; i++)
        {
          writePointer = pol->GxTransforms[i];
          for (j = 0; j < 51 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
          *writePointer = '\0';
          // eat the trailing newline
          if (*commandReply == '\n')
          {
            commandReply++;
          }
        }
        // grab the status flags
        writePointer = pol->GxStatus + k / 3 * 8;
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_ADDITIONAL_INFO)
    {
      // grab information for each port
      for (i = 0; i < activeCount; i++)
      {
        writePointer = pol->GxInformation[i];
        for (j = 0; j < 12 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_SINGLE_STRAY)
    {
      // grab stray marker for each port
      for (i = 0; i < activeCount; i++)
      {
        writePointer = pol->GxSingleStray[i];
        for (j = 0; j < 21 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
        *writePointer = '\0';
        // eat the trailing newline
        if (*commandReply == '\n')
        {
          commandReply++;
        }
      }
    }

    if (mode & NDI_FRAME_NUMBER)
    {
      // get frame number for each port
      for (i = 0; i < activeCount; i++)
      {
        writePointer = pol->GxFrame[i];
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    // if there is no passive information, stop here
    if (!(mode & NDI_PASSIVE))
    {
      return;
    }

    // in case there are 9 passive tools instead of just 3
    passiveCount = 3;
    if (mode & NDI_PASSIVE_EXTRA)
    {
      passiveCount = 9;
    }

    if ((mode & NDI_XFORMS_AND_STATUS) || (mode == NDI_PASSIVE))
    {
      // the information is grouped in threes
      for (k = 0; k < passiveCount; k += 3)
      {
        // grab the three transforms
        for (i = 0; i < 3; i++)
        {
          writePointer = pol->GxPassiveTransforms[k + i];
          for (j = 0; j < 51 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
          *writePointer = '\0';
          // eat the trailing newline
          if (*commandReply == '\n')
          {
            commandReply++;
          }
        }
        // grab the status flags
        writePointer = pol->GxPassiveStatus + k / 3 * 8;
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
        // skip the newline
        if (*commandReply == '\n')
        {
          commandReply++;
        }
        else   // no newline: no more passive transforms
        {
          passiveCount = k + 3;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_ADDITIONAL_INFO)
    {
      // grab information for each port
      for (i = 0; i < passiveCount; i++)
      {
        writePointer = pol->GxPassiveInformation[i];
        for (j = 0; j < 12 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_FRAME_NUMBER)
    {
      // get frame number for each port
      for (i = 0; i < passiveCount; i++)
      {
        writePointer = pol->GxPassiveFrame[i];
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_PASSIVE_STRAY)
    {
      // get all the passive stray information
      // this will be a maximum of 3 + 20*3*7 = 423 bytes
      writePointer = pol->GxPassiveStray;
      for (j = 0; j < 423 && *commandReply >= ' '; j++)
      {
        *writePointer++ = *commandReply++;
      }
    }
  }